

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_b047::Encode_FromString_Test::TestBody(Encode_FromString_Test *this)

{
  AssertionResult *pAVar1;
  char *message;
  char *in_R9;
  initializer_list<unsigned_char> __l;
  AssertHelper local_f0;
  AssertHelper local_e8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Bytes expected;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_98;
  byte local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  char local_58;
  string local_50;
  string hash;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hash,"8a173fd3e32c0fa78b90fe42d305f202244e2739",
             (allocator<char> *)&local_98._M_value);
  local_98._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x2ce3d33f178a1411;
  local_98._M_value._M_string_length._0_6_ = 0x42fe908ba70f;
  local_98._M_value._M_string_length._6_2_ = 0x5d3;
  local_98._16_6_ = 0x39274e2402f2;
  __l._M_len = 0x16;
  __l._M_array = (iterator)&local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&expected,__l,(allocator_type *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_50,(string *)&hash);
  multihash::encode((ResBytes *)&local_98._M_value,&local_50,0x11);
  std::__cxx11::string::~string((string *)&local_50);
  gtest_ar_.success_ = (bool)(local_78 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (local_78 == 0) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ = (bool)local_58;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_58 != '\0') {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      if (local_58 == '\0') {
        std::__throw_bad_optional_access();
      }
      testing::internal::
      CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((internal *)&gtest_ar,"expected","optEncoded.value()",&expected,&local_70);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                   ,0xc4,message);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      pAVar1 = &gtest_ar;
      goto LAB_0010c665;
    }
    testing::Message::Message((Message *)&local_f0);
    std::operator<<((ostream *)&(local_f0.data_)->line,"An encoded multihash should be returned");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"optEncoded","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0xc2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
  }
  else {
    testing::Message::Message((Message *)&local_f0);
    std::operator<<((ostream *)&(local_f0.data_)->line,"Expected no error. error: \'");
    if (local_78 == 0) {
      std::__throw_bad_optional_access();
    }
    std::operator<<((ostream *)&(local_f0.data_)->line,(string *)&local_98._M_value);
    std::operator<<((ostream *)&(local_f0.data_)->line,"\'");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"optErr","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0xc1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
  }
  pAVar1 = &gtest_ar_;
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_f0);
LAB_0010c665:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  std::
  _Tuple_impl<0UL,_std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_98._M_value);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&hash);
  return;
}

Assistant:

TEST(Encode, FromString) {
	std::string hash = "8a173fd3e32c0fa78b90fe42d305f202244e2739";
	multihash::Bytes expected{
	    0x11, 0x14, 0x8a, 0x17, 0x3f, 0xd3, 0xe3, 0x2c, 0x0f, 0xa7, 0x8b,
	    0x90, 0xfe, 0x42, 0xd3, 0x05, 0xf2, 0x02, 0x24, 0x4e, 0x27, 0x39,
	};

	auto [optEncoded, optErr] = multihash::encode(hash, 0x11);
	ASSERT_FALSE(optErr) << "Expected no error. error: '" << optErr.value() << "'";
	ASSERT_TRUE(optEncoded) << "An encoded multihash should be returned";

	EXPECT_EQ(expected, optEncoded.value());
}